

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O1

int __thiscall
booster::aio::stream_socket::connect(stream_socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  error_category *peVar1;
  native_type __fd_00;
  int iVar2;
  int *piVar3;
  undefined4 in_register_00000034;
  pair<const_sockaddr_*,_int> pVar4;
  
  pVar4 = endpoint::raw((endpoint *)CONCAT44(in_register_00000034,__fd));
  do {
    __fd_00 = basic_io_device::native((basic_io_device *)this);
    iVar2 = ::connect(__fd_00,(sockaddr *)pVar4.first,pVar4.second);
    if (-1 < iVar2) {
      return iVar2;
    }
    piVar3 = __errno_location();
    peVar1 = syscat;
    iVar2 = *piVar3;
  } while (iVar2 == 4);
  __addr->sa_family = (short)iVar2;
  __addr->sa_data[0] = (char)((uint)iVar2 >> 0x10);
  __addr->sa_data[1] = (char)((uint)iVar2 >> 0x18);
  *(error_category **)(__addr->sa_data + 6) = peVar1;
  return iVar2;
}

Assistant:

void stream_socket::connect(endpoint const &ep,system::error_code &e)
{
	endpoint::native_address_type address = ep.raw();
	#ifndef BOOSTER_WIN32
	for(;;) {
		int res = ::connect(native(),address.first,address.second);
		if(res < 0 && errno==EINTR)
			continue;
		if(res < 0) {
			e=geterror();
			return;
		}
		break;
	}
	#else
	if(::connect(native(),address.first,address.second) < 0)
		e=geterror();
	#endif
}